

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

iterator __thiscall
pybind11::
make_iterator<(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>
          (pybind11 *this,
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
          first,_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
                last)

{
  iterator iVar1;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
  last_local;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
  first_local;
  
  iVar1 = detail::
          make_iterator_impl<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>
                    ((detail *)this,first,last);
  iVar1.super_object.super_handle.m_ptr = (handle)(handle)this;
  return iVar1;
}

Assistant:

iterator make_iterator(Iterator first, Sentinel last, Extra &&... extra) {
    return detail::make_iterator_impl<
        detail::iterator_access<Iterator>,
        Policy,
        Iterator,
        Sentinel,
        ValueType,
        Extra...>(first, last, std::forward<Extra>(extra)...);
}